

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnnoise_demo.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  DenoiseState *st;
  FILE *__stream;
  FILE *__s;
  long lVar4;
  short tmp [480];
  float x [480];
  short local_b78 [480];
  float local_7b8 [482];
  
  st = rnnoise_create((RNNModel *)0x0);
  if (argc == 3) {
    __stream = fopen(argv[1],"rb");
    __s = fopen(argv[2],"wb");
    bVar1 = true;
    do {
      fread(local_b78,2,0x1e0,__stream);
      iVar3 = feof(__stream);
      if (iVar3 == 0) {
        lVar4 = 0;
        do {
          local_7b8[lVar4] = (float)(int)local_b78[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x1e0);
        rnnoise_process_frame(st,local_7b8,local_7b8);
        lVar4 = 0;
        do {
          local_b78[lVar4] = (short)(int)local_7b8[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x1e0);
        bVar2 = !bVar1;
        bVar1 = false;
        if (bVar2) {
          fwrite(local_b78,2,0x1e0,__s);
        }
      }
    } while (iVar3 == 0);
    rnnoise_destroy(st);
    fclose(__stream);
    fclose(__s);
    iVar3 = 0;
  }
  else {
    main_cold_1();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int first = 1; // 标记是否是第一帧pcm
    float x[FRAME_SIZE];
    FILE *f1, *fout;
    DenoiseState *st;
    st = rnnoise_create(NULL);
    if (argc != 3) {
        fprintf(stderr, "usage: %s <noisy speech> <output denoised>\n", argv[0]);
        return 1;
    }
    f1 = fopen(argv[1], "rb");
    fout = fopen(argv[2], "wb");
    while (1) {
        short tmp[FRAME_SIZE];
        fread(tmp, sizeof(short), FRAME_SIZE, f1); // 从文件流中读数据
        if (feof(f1)) break; // 达到文件结尾
        for (i = 0; i < FRAME_SIZE; i++) x[i] = tmp[i];
        rnnoise_process_frame(st, x, x);
        for (i = 0; i < FRAME_SIZE; i++) tmp[i] = x[i];
        if (!first) fwrite(tmp, sizeof(short), FRAME_SIZE, fout);
        // 第一帧不处理不保存, 从第二帧开始保存, out文件自然会少一帧, 但不影响PESQ的测试
        // 一帧480个采样点,每个采样点short类型的2字节，少的一帧就是960字节
        first = 0;
    }
    rnnoise_destroy(st);
    fclose(f1);
    fclose(fout);
    return 0;
}